

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-projection.c
# Opt level: O0

_Bool borg_target(loc t)

{
  borg_kill *pbVar1;
  char *pcVar2;
  borg_kill *kill;
  borg_grid *ag;
  wchar_t y2;
  wchar_t x2;
  wchar_t y1;
  wchar_t x1;
  loc t_local;
  
  x1 = t.y;
  y1 = t.x;
  pbVar1 = borg_kills + borg_grids[x1][y1].kill;
  if (borg_grids[x1][y1].kill == '\0') {
    pcVar2 = format("# Targetting location (%d,%d)",(ulong)(uint)x1,(ulong)t & 0xffffffff);
    borg_note(pcVar2);
  }
  else {
    pcVar2 = borg_race_name((uint)pbVar1->r_idx);
    pcVar2 = format("# Targeting %s who has %d Hit Points (%d,%d).",pcVar2,
                    (ulong)(uint)(int)pbVar1->power,(ulong)(uint)x1,(ulong)t & 0xffffffff);
    borg_note(pcVar2);
  }
  borg_keypress(0x2a);
  borg_keypress(0x70);
  x2 = borg.c.x;
  for (y2 = borg.c.y; y2 < x1 && x2 < y1; y2 = y2 + L'\x01') {
    borg_keypress(0x33);
    x2 = x2 + L'\x01';
  }
  for (; y2 < x1 && y1 < x2; y2 = y2 + L'\x01') {
    borg_keypress(0x31);
    x2 = x2 + L'\xffffffff';
  }
  for (; x1 < y2 && x2 < y1; y2 = y2 + L'\xffffffff') {
    borg_keypress(0x39);
    x2 = x2 + L'\x01';
  }
  for (; x1 < y2 && y1 < x2; y2 = y2 + L'\xffffffff') {
    borg_keypress(0x37);
    x2 = x2 + L'\xffffffff';
  }
  for (; y2 < x1; y2 = y2 + L'\x01') {
    borg_keypress(0x32);
  }
  for (; x1 < y2; y2 = y2 + L'\xffffffff') {
    borg_keypress(0x38);
  }
  for (; x2 < y1; x2 = x2 + L'\x01') {
    borg_keypress(0x36);
  }
  for (; y1 < x2; x2 = x2 + L'\xffffffff') {
    borg_keypress(0x34);
  }
  borg_keypress(0x35);
  borg_target_loc.y = x1;
  borg_target_loc.x = y1;
  return true;
}

Assistant:

bool borg_target(struct loc t)
{
    int x1, y1, x2, y2;

    borg_grid *ag;
    borg_kill *kill;

    ag   = &borg_grids[t.y][t.x];
    kill = &borg_kills[ag->kill];

    /* Log */
    /* Report a little bit */
    if (ag->kill) {
        borg_note(format("# Targeting %s who has %d Hit Points (%d,%d).",
            borg_race_name(kill->r_idx), kill->power, t.y, t.x));
    } else {
        borg_note(format("# Targetting location (%d,%d)", t.y, t.x));
    }

    /* Target mode */
    borg_keypress('*');

    /* Target a location */
    borg_keypress('p');

    /* Determine "path" */
    x1 = borg.c.x;
    y1 = borg.c.y;
    x2 = t.x;
    y2 = t.y;

    /* Move to the location (diagonals) */
    for (; (y1 < y2) && (x1 < x2); y1++, x1++)
        borg_keypress('3');
    for (; (y1 < y2) && (x1 > x2); y1++, x1--)
        borg_keypress('1');
    for (; (y1 > y2) && (x1 < x2); y1--, x1++)
        borg_keypress('9');
    for (; (y1 > y2) && (x1 > x2); y1--, x1--)
        borg_keypress('7');

    /* Move to the location */
    for (; y1 < y2; y1++)
        borg_keypress('2');
    for (; y1 > y2; y1--)
        borg_keypress('8');
    for (; x1 < x2; x1++)
        borg_keypress('6');
    for (; x1 > x2; x1--)
        borg_keypress('4');

    /* Select the target */
    borg_keypress('5');

    /* Carry these variables to be used on reporting spell
     * pathway
     */
    borg_target_loc.y = t.y;
    borg_target_loc.x = t.x;

    /* Success */
    return true;
}